

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::bt_peer_connection::write_pe_vc_cryptofield
          (bt_peer_connection *this,span<char> write_buf,int crypto_field,int pad_size)

{
  bool bVar1;
  char *__s;
  span<char> sVar2;
  bt_peer_connection *local_58;
  char *local_50;
  aux *local_48;
  bt_peer_connection *local_38;
  char *local_30;
  int pad_size_local;
  int crypto_field_local;
  bt_peer_connection *this_local;
  span<char> write_buf_local;
  
  write_buf_local.m_ptr = (char *)write_buf.m_len;
  this_local = (bt_peer_connection *)write_buf.m_ptr;
  __s = span<char>::data((span<char> *)&this_local);
  memset(__s,0,8);
  sVar2 = span<char>::subspan((span<char> *)&this_local,8);
  local_38 = (bt_peer_connection *)sVar2.m_ptr;
  this_local = local_38;
  local_30 = (char *)sVar2.m_len;
  write_buf_local.m_ptr = local_30;
  write_uint32<int,char>(crypto_field,(span<char> *)&this_local);
  write_uint16<int,char>(pad_size,(span<char> *)&this_local);
  sVar2 = span<char>::first((span<char> *)&this_local,(long)pad_size);
  local_48 = (aux *)sVar2.m_ptr;
  sVar2.m_ptr = sVar2.m_len;
  random_bytes(local_48,sVar2);
  sVar2 = span<char>::subspan((span<char> *)&this_local,(long)pad_size);
  local_58 = (bt_peer_connection *)sVar2.m_ptr;
  this_local = local_58;
  local_50 = (char *)sVar2.m_len;
  write_buf_local.m_ptr = local_50;
  bVar1 = peer_connection::is_outgoing(&this->super_peer_connection);
  if (bVar1) {
    write_uint16<unsigned_long,char>(0x44,(span<char> *)&this_local);
  }
  return;
}

Assistant:

void bt_peer_connection::write_pe_vc_cryptofield(
		span<char> write_buf
		, int const crypto_field
		, int const pad_size)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(crypto_field <= 0x03 && crypto_field > 0);
		// vc,crypto_field,len(pad),pad, (len(ia))
		TORRENT_ASSERT((write_buf.size() >= 8+4+2+pad_size+2
				&& is_outgoing())
			|| (write_buf.size() >= 8+4+2+pad_size && !is_outgoing()));
		TORRENT_ASSERT(!m_sent_handshake);

		// encrypt(vc, crypto_provide/select, len(Pad), len(IA))
		// len(pad) is zero for now, len(IA) only for outgoing connections

		// vc
		std::memset(write_buf.data(), 0, 8);
		write_buf = write_buf.subspan(8);

		aux::write_uint32(crypto_field, write_buf);
		aux::write_uint16(pad_size, write_buf); // len (pad)

		aux::random_bytes(write_buf.first(pad_size));
		write_buf = write_buf.subspan(pad_size);

		// append len(ia) if we are initiating
		if (is_outgoing())
			aux::write_uint16(handshake_len, write_buf); // len(IA)
	}